

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scpserver.c
# Opt level: O0

void scp_source_process_stack(ScpSource *scp)

{
  ScpSourceStackEntry *pSVar1;
  ptrlen path;
  ptrlen pathname_00;
  _Bool _Var2;
  uint uVar3;
  int iVar4;
  char *wildcard_00;
  char *output;
  char *pcVar5;
  size_t sVar6;
  void *__dest;
  ptrlen pVar7;
  char *subpath_space;
  ptrlen subpath;
  ScpSourceStackEntry *node;
  ScpSourceStackEntry *node_2;
  uint64_t limit;
  int backlog;
  char *local_78;
  void *local_70;
  char *local_68;
  void *local_60;
  char *last_slash;
  void *local_48;
  char *local_40;
  char *wildcard;
  ptrlen pathname;
  char *rootpath_unesc;
  char *rootpath_str;
  ScpSourceStackEntry *node_1;
  ScpSource *scp_local;
  
  if ((scp->throttled & 1U) == 0) {
    while (0 < scp->n_pending_commands) {
      if ((scp->eof & 1U) != 0) {
        scp_source_abort(scp,"scp: received client EOF, abandoning transfer");
        return;
      }
      if (scp->acks == 0) {
        return;
      }
      scp->acks = scp->acks + -1;
      if (scp->pending_commands[0]->len != 0) {
        sshfwd_write(scp->sc,scp->pending_commands[0]->s,scp->pending_commands[0]->len);
      }
      strbuf_free(scp->pending_commands[0]);
      scp->n_pending_commands = scp->n_pending_commands + -1;
      if (0 < scp->n_pending_commands) {
        memmove(scp->pending_commands,scp->pending_commands + 1,(long)scp->n_pending_commands << 3);
      }
    }
    if ((((scp->head == (ScpSourceStackEntry *)0x0) || (scp->head->type != SCP_READFILE)) ||
        (scp->file_offset == 0)) &&
       ((scp->head != (ScpSourceStackEntry *)0x0 && (scp->head->type == SCP_ROOTPATH)))) {
      pSVar1 = scp->head;
      scp->head = pSVar1->next;
      wildcard_00 = mkstr(pSVar1->pathname);
      output = (char *)safemalloc((pSVar1->pathname).len + 1,1,0);
      _Var2 = wc_unescape(output,wildcard_00);
      if (_Var2) {
        pVar7 = ptrlen_from_asciz(wildcard_00);
        last_slash = (char *)pVar7.ptr;
        wildcard = last_slash;
        local_48 = (void *)pVar7.len;
        pathname.ptr = local_48;
        local_40 = (char *)0x0;
      }
      else {
        pcVar5 = strrchr(wildcard_00,0x2f);
        if (pcVar5 == (char *)0x0) {
          pVar7 = make_ptrlen(".",1);
          local_78 = (char *)pVar7.ptr;
          wildcard = local_78;
          local_70 = (void *)pVar7.len;
          pathname.ptr = local_70;
          local_40 = wildcard_00;
        }
        else {
          *pcVar5 = '\0';
          _Var2 = wc_unescape(output,wildcard_00);
          if (!_Var2) {
            scp_source_abort(scp,
                             "scp: wildcards in path components before the file name not supported")
            ;
            safefree(wildcard_00);
            safefree(output);
            return;
          }
          pVar7 = ptrlen_from_asciz(output);
          local_68 = (char *)pVar7.ptr;
          wildcard = local_68;
          local_60 = (void *)pVar7.len;
          pathname.ptr = local_60;
          local_40 = pcVar5 + 1;
        }
      }
      path.len = (size_t)pathname.ptr;
      path.ptr = wildcard;
      sftpsrv_stat(scp->sf,&(scp->reply).srb,path,true);
      if (((scp->reply).err & 1U) == 0) {
        pathname_00.len = (size_t)pathname.ptr;
        pathname_00.ptr = wildcard;
        scp_source_push_name(scp,pathname_00,(scp->reply).attrs,local_40);
        safefree(wildcard_00);
        safefree(output);
        safefree(pSVar1);
        scp_requeue(scp);
      }
      else {
        uVar3 = string_length_for_printf((size_t)pathname.ptr);
        scp_source_abort(scp,"%.*s: unable to access: %s",(ulong)uVar3,wildcard,(scp->reply).errmsg)
        ;
        safefree(wildcard_00);
        safefree(output);
        safefree(pSVar1);
      }
    }
    else if ((scp->head == (ScpSourceStackEntry *)0x0) || (scp->head->type != SCP_READFILE)) {
      if (scp->head == (ScpSourceStackEntry *)0x0) {
        sshfwd_send_exit_status(scp->sc,0);
        sshfwd_write_eof(scp->sc);
        sshfwd_initiate_close(scp->sc,(char *)0x0);
        scp->finished = true;
      }
      else {
        subpath.len = (size_t)scp->head;
        scp->head = ((ScpSourceStackEntry *)subpath.len)->next;
        if (((ScpSourceStackEntry *)subpath.len)->type == SCP_READDIR) {
          sftpsrv_readdir(scp->sf,&(scp->reply).srb,((ScpSourceStackEntry *)subpath.len)->handle,1,
                          true);
          if (((scp->reply).err & 1U) == 0) {
            _Var2 = ptrlen_eq_string((scp->reply).name,".");
            if (((_Var2) || (_Var2 = ptrlen_eq_string((scp->reply).name,".."), _Var2)) ||
               ((((ScpSourceStackEntry *)subpath.len)->wildcard != (char *)0x0 &&
                (iVar4 = wc_match_pl(((ScpSourceStackEntry *)subpath.len)->wildcard,
                                     (scp->reply).name), iVar4 == 0)))) {
              scp->head = (ScpSourceStackEntry *)subpath.len;
            }
            else {
              sVar6 = (((ScpSourceStackEntry *)subpath.len)->pathname).len + 1 +
                      (scp->reply).name.len;
              __dest = safemalloc(sVar6,1,0);
              memcpy(__dest,(((ScpSourceStackEntry *)subpath.len)->pathname).ptr,
                     (((ScpSourceStackEntry *)subpath.len)->pathname).len);
              *(undefined1 *)((long)__dest + (((ScpSourceStackEntry *)subpath.len)->pathname).len) =
                   0x2f;
              memcpy((void *)((long)__dest +
                             (((ScpSourceStackEntry *)subpath.len)->pathname).len + 1),
                     (scp->reply).name.ptr,(scp->reply).name.len);
              scp->head = (ScpSourceStackEntry *)subpath.len;
              pVar7.len = sVar6;
              pVar7.ptr = __dest;
              scp_source_push_name(scp,pVar7,(scp->reply).attrs,(char *)0x0);
              safefree(__dest);
            }
            subpath.len = 0;
          }
          else {
            if ((scp->reply).code != 1) {
              uVar3 = string_length_for_printf((((ScpSourceStackEntry *)subpath.len)->pathname).len)
              ;
              scp_source_err(scp,"%.*s: unable to list directory: %s",(ulong)uVar3,
                             (((ScpSourceStackEntry *)subpath.len)->pathname).ptr,
                             (scp->reply).errmsg);
            }
            sftpsrv_close(scp->sf,&(scp->reply).srb,((ScpSourceStackEntry *)subpath.len)->handle);
            if (((ScpSourceStackEntry *)subpath.len)->wildcard == (char *)0x0) {
              scp_source_send_E(scp);
            }
          }
        }
        else if (((((ScpSourceStackEntry *)subpath.len)->attrs).permissions & 0x4000) == 0) {
          sftpsrv_open(scp->sf,&(scp->reply).srb,((ScpSourceStackEntry *)subpath.len)->pathname,1,
                       (fxp_attrs)ZEXT1656(ZEXT816(0)));
          if (((scp->reply).err & 1U) != 0) {
            uVar3 = string_length_for_printf((((ScpSourceStackEntry *)subpath.len)->pathname).len);
            scp_source_err(scp,"%.*s: unable to open: %s",(ulong)uVar3,
                           (((ScpSourceStackEntry *)subpath.len)->pathname).ptr,(scp->reply).errmsg)
            ;
            scp_requeue(scp);
            return;
          }
          sftpsrv_fstat(scp->sf,&(scp->reply).srb,(scp->reply).handle);
          if (((scp->reply).err & 1U) != 0) {
            uVar3 = string_length_for_printf((((ScpSourceStackEntry *)subpath.len)->pathname).len);
            scp_source_err(scp,"%.*s: unable to stat: %s",(ulong)uVar3,
                           (((ScpSourceStackEntry *)subpath.len)->pathname).ptr,(scp->reply).errmsg)
            ;
            sftpsrv_close(scp->sf,&(scp->reply).srb,(scp->reply).handle);
            scp_requeue(scp);
            return;
          }
          scp->file_offset = 0;
          scp->file_size = (scp->reply).attrs.size;
          scp_source_send_CD(scp,'C',((ScpSourceStackEntry *)subpath.len)->attrs,scp->file_size,
                             ((ScpSourceStackEntry *)subpath.len)->pathname);
          scp_source_push(scp,SCP_READFILE,((ScpSourceStackEntry *)subpath.len)->pathname,
                          (scp->reply).handle,(fxp_attrs *)0x0,(char *)0x0);
        }
        else {
          if (((scp->recursive & 1U) == 0) &&
             (((ScpSourceStackEntry *)subpath.len)->wildcard == (char *)0x0)) {
            __assert_fail("scp->recursive || node->wildcard",
                          "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/scpserver.c"
                          ,0x332,"void scp_source_process_stack(ScpSource *)");
          }
          if (((ScpSourceStackEntry *)subpath.len)->wildcard == (char *)0x0) {
            scp_source_send_CD(scp,'D',((ScpSourceStackEntry *)subpath.len)->attrs,0,
                               ((ScpSourceStackEntry *)subpath.len)->pathname);
          }
          sftpsrv_opendir(scp->sf,&(scp->reply).srb,((ScpSourceStackEntry *)subpath.len)->pathname);
          if (((scp->reply).err & 1U) == 0) {
            scp_source_push(scp,SCP_READDIR,((ScpSourceStackEntry *)subpath.len)->pathname,
                            (scp->reply).handle,(fxp_attrs *)0x0,
                            ((ScpSourceStackEntry *)subpath.len)->wildcard);
          }
          else {
            uVar3 = string_length_for_printf((((ScpSourceStackEntry *)subpath.len)->pathname).len);
            scp_source_err(scp,"%.*s: unable to access: %s",(ulong)uVar3,
                           (((ScpSourceStackEntry *)subpath.len)->pathname).ptr,(scp->reply).errmsg)
            ;
            if (((ScpSourceStackEntry *)subpath.len)->wildcard == (char *)0x0) {
              scp_source_send_E(scp);
            }
          }
        }
        safefree((void *)subpath.len);
        scp_requeue(scp);
      }
    }
    else {
      node_2 = (ScpSourceStackEntry *)(scp->file_size - scp->file_offset);
      if ((ScpSourceStackEntry *)0x1000 < node_2) {
        node_2 = (ScpSourceStackEntry *)0x1000;
      }
      if (node_2 == (ScpSourceStackEntry *)0x0) {
        sshfwd_write(scp->sc,"",1);
        sftpsrv_close(scp->sf,&(scp->reply).srb,scp->head->handle);
        pSVar1 = scp->head;
        scp->head = pSVar1->next;
        safefree(pSVar1);
        scp_requeue(scp);
      }
      else {
        sftpsrv_read(scp->sf,&(scp->reply).srb,scp->head->handle,scp->file_offset,(uint)node_2);
        if (((scp->reply).err & 1U) == 0) {
          sVar6 = sshfwd_write(scp->sc,(scp->reply).data.ptr,(scp->reply).data.len);
          scp->file_offset = (scp->reply).data.len + scp->file_offset;
          if ((int)sVar6 < 0x10000) {
            scp_requeue(scp);
          }
        }
        else {
          uVar3 = string_length_for_printf((scp->head->pathname).len);
          scp_source_abort(scp,"%.*s: unable to read: %s",(ulong)uVar3,(scp->head->pathname).ptr,
                           (scp->reply).errmsg);
        }
      }
    }
  }
  return;
}

Assistant:

static void scp_source_process_stack(ScpSource *scp)
{
    if (scp->throttled)
        return;

    while (scp->n_pending_commands > 0) {
        /* Expect an ack, and consume it */
        if (scp->eof) {
            scp_source_abort(
                scp, "scp: received client EOF, abandoning transfer");
            return;
        }
        if (scp->acks == 0)
            return;
        scp->acks--;

        /*
         * Now send the actual command (unless it was the phony
         * zero-length one that indicates our need for an ack before
         * beginning to send file data).
         */

        if (scp->pending_commands[0]->len)
            sshfwd_write(scp->sc, scp->pending_commands[0]->s,
                         scp->pending_commands[0]->len);

        strbuf_free(scp->pending_commands[0]);
        scp->n_pending_commands--;
        if (scp->n_pending_commands > 0) {
            /*
             * We still have at least one pending command to send, so
             * move up the queue.
             *
             * (We do that with a bodgy memmove, because there are at
             * most a bounded number of commands ever pending at once,
             * so no need to worry about quadratic time.)
             */
            memmove(scp->pending_commands, scp->pending_commands+1,
                    scp->n_pending_commands * sizeof(*scp->pending_commands));
        }
    }

    /*
     * Mostly, we start by waiting for an ack byte from the receiver.
     */
    if (scp->head && scp->head->type == SCP_READFILE && scp->file_offset) {
        /*
         * Exception: if we're already in the middle of transferring a
         * file, we'll be called back here because the channel backlog
         * has cleared; we don't need to wait for an ack.
         */
    } else if (scp->head && scp->head->type == SCP_ROOTPATH) {
        /*
         * Another exception: the initial action node that makes us
         * stat the root path. We'll translate it into an SCP_NAME,
         * and _that_ will require an ack.
         */
        ScpSourceStackEntry *node = scp->head;
        scp->head = node->next;

        /*
         * Start by checking if there's a wildcard involved in the
         * root path.
         */
        char *rootpath_str = mkstr(node->pathname);
        char *rootpath_unesc = snewn(1+node->pathname.len, char);
        ptrlen pathname;
        const char *wildcard;

        if (wc_unescape(rootpath_unesc, rootpath_str)) {
            /*
             * We successfully removed instances of the escape
             * character used in our wildcard syntax, without
             * encountering any actual wildcard chars - i.e. this is
             * not a wildcard, just a single file. The simple case.
             */
            pathname = ptrlen_from_asciz(rootpath_str);
            wildcard = NULL;
        } else {
            /*
             * This is a wildcard. Separate it into a directory name
             * (which we enforce mustn't contain wc characters, for
             * simplicity) and a wildcard to match leaf names.
             */
            char *last_slash = strrchr(rootpath_str, '/');

            if (last_slash) {
                wildcard = last_slash + 1;
                *last_slash = '\0';
                if (!wc_unescape(rootpath_unesc, rootpath_str)) {
                    scp_source_abort(scp, "scp: wildcards in path components "
                                     "before the file name not supported");
                    sfree(rootpath_str);
                    sfree(rootpath_unesc);
                    return;
                }

                pathname = ptrlen_from_asciz(rootpath_unesc);
            } else {
                pathname = PTRLEN_LITERAL(".");
                wildcard = rootpath_str;
            }
        }

        /*
         * Now we know what directory we're scanning, and what
         * wildcard (if any) we're using to match the filenames we get
         * back.
         */
        sftpsrv_stat(scp->sf, &scp->reply.srb, pathname, true);
        if (scp->reply.err) {
            scp_source_abort(
                scp, "%.*s: unable to access: %s",
                PTRLEN_PRINTF(pathname), scp->reply.errmsg);
            sfree(rootpath_str);
            sfree(rootpath_unesc);
            sfree(node);
            return;
        }

        scp_source_push_name(scp, pathname, scp->reply.attrs, wildcard);

        sfree(rootpath_str);
        sfree(rootpath_unesc);
        sfree(node);
        scp_requeue(scp);
        return;
    } else {
    }

    if (scp->head && scp->head->type == SCP_READFILE) {
        /*
         * Transfer file data if our backlog hasn't filled up.
         */
        int backlog;
        uint64_t limit = scp->file_size - scp->file_offset;
        if (limit > 4096)
            limit = 4096;
        if (limit > 0) {
            sftpsrv_read(scp->sf, &scp->reply.srb, scp->head->handle,
                         scp->file_offset, limit);
            if (scp->reply.err) {
                scp_source_abort(
                    scp, "%.*s: unable to read: %s",
                    PTRLEN_PRINTF(scp->head->pathname), scp->reply.errmsg);
                return;
            }

            backlog = sshfwd_write(
                scp->sc, scp->reply.data.ptr, scp->reply.data.len);
            scp->file_offset += scp->reply.data.len;

            if (backlog < SCP_MAX_BACKLOG)
                scp_requeue(scp);
            return;
        }

        /*
         * If we're done, send a terminating zero byte, close our file
         * handle, and pop the stack.
         */
        sshfwd_write(scp->sc, "\0", 1);
        sftpsrv_close(scp->sf, &scp->reply.srb, scp->head->handle);
        ScpSourceStackEntry *node = scp->head;
        scp->head = node->next;
        sfree(node);
        scp_requeue(scp);
        return;
    }

    /*
     * If our queue is actually empty, send outgoing EOF.
     */
    if (!scp->head) {
        sshfwd_send_exit_status(scp->sc, 0);
        sshfwd_write_eof(scp->sc);
        sshfwd_initiate_close(scp->sc, NULL);
        scp->finished = true;
        return;
    }

    /*
     * Otherwise, handle a command.
     */
    ScpSourceStackEntry *node = scp->head;
    scp->head = node->next;

    if (node->type == SCP_READDIR) {
        sftpsrv_readdir(scp->sf, &scp->reply.srb, node->handle, 1, true);
        if (scp->reply.err) {
            if (scp->reply.code != SSH_FX_EOF)
                scp_source_err(scp, "%.*s: unable to list directory: %s",
                               PTRLEN_PRINTF(node->pathname),
                               scp->reply.errmsg);
            sftpsrv_close(scp->sf, &scp->reply.srb, node->handle);

            if (!node->wildcard) {
                /*
                 * Send 'pop stack' or 'end of directory' command,
                 * unless this was the topmost READDIR in a
                 * wildcard-based retrieval (in which case we didn't
                 * send a D command to start, so an E now would have
                 * no stack entry to pop).
                 */
                scp_source_send_E(scp);
            }
        } else if (ptrlen_eq_string(scp->reply.name, ".") ||
                   ptrlen_eq_string(scp->reply.name, "..") ||
                   (node->wildcard &&
                    !wc_match_pl(node->wildcard, scp->reply.name))) {
            /* Skip special directory names . and .., and anything
             * that doesn't match our wildcard (if we have one). */
            scp->head = node;     /* put back the unfinished READDIR */
            node = NULL;          /* and prevent it being freed */
        } else {
            ptrlen subpath;
            subpath.len = node->pathname.len + 1 + scp->reply.name.len;
            char *subpath_space = snewn(subpath.len, char);
            subpath.ptr = subpath_space;
            memcpy(subpath_space, node->pathname.ptr, node->pathname.len);
            subpath_space[node->pathname.len] = '/';
            memcpy(subpath_space + node->pathname.len + 1,
                   scp->reply.name.ptr, scp->reply.name.len);

            scp->head = node;     /* put back the unfinished READDIR */
            node = NULL;          /* and prevent it being freed */
            scp_source_push_name(scp, subpath, scp->reply.attrs, NULL);

            sfree(subpath_space);
        }
    } else if (node->attrs.permissions & PERMS_DIRECTORY) {
        assert(scp->recursive || node->wildcard);

        if (!node->wildcard)
            scp_source_send_CD(scp, 'D', node->attrs, 0, node->pathname);
        sftpsrv_opendir(scp->sf, &scp->reply.srb, node->pathname);
        if (scp->reply.err) {
            scp_source_err(
                scp, "%.*s: unable to access: %s",
                PTRLEN_PRINTF(node->pathname), scp->reply.errmsg);

            if (!node->wildcard) {
                /* Send 'pop stack' or 'end of directory' command. */
                scp_source_send_E(scp);
            }
        } else {
            scp_source_push(
                scp, SCP_READDIR, node->pathname,
                scp->reply.handle, NULL, node->wildcard);
        }
    } else {
        sftpsrv_open(scp->sf, &scp->reply.srb,
                     node->pathname, SSH_FXF_READ, no_attrs);
        if (scp->reply.err) {
            scp_source_err(
                scp, "%.*s: unable to open: %s",
                PTRLEN_PRINTF(node->pathname), scp->reply.errmsg);
            scp_requeue(scp);
            return;
        }
        sftpsrv_fstat(scp->sf, &scp->reply.srb, scp->reply.handle);
        if (scp->reply.err) {
            scp_source_err(
                scp, "%.*s: unable to stat: %s",
                PTRLEN_PRINTF(node->pathname), scp->reply.errmsg);
            sftpsrv_close(scp->sf, &scp->reply.srb, scp->reply.handle);
            scp_requeue(scp);
            return;
        }
        scp->file_offset = 0;
        scp->file_size = scp->reply.attrs.size;
        scp_source_send_CD(scp, 'C', node->attrs,
                           scp->file_size, node->pathname);
        scp_source_push(
            scp, SCP_READFILE, node->pathname, scp->reply.handle, NULL, NULL);
    }
    sfree(node);
    scp_requeue(scp);
}